

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableType.cpp
# Opt level: O0

bool __thiscall rsg::VariableType::operator!=(VariableType *this,VariableType *other)

{
  bool bVar1;
  VariableType *other_local;
  VariableType *this_local;
  
  if (this->m_baseType == other->m_baseType) {
    if (this->m_precision == other->m_precision) {
      if (this->m_numElements == other->m_numElements) {
        if ((this->m_elementType != (VariableType *)0x0) ==
            (other->m_elementType != (VariableType *)0x0)) {
          if ((this->m_elementType == (VariableType *)0x0) ||
             (bVar1 = operator!=(this->m_elementType,other->m_elementType), !bVar1)) {
            bVar1 = std::operator!=(&this->m_members,&other->m_members);
            if (bVar1) {
              this_local._7_1_ = true;
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = true;
          }
        }
        else {
          this_local._7_1_ = true;
        }
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool VariableType::operator!= (const VariableType& other) const
{
	if (m_baseType != other.m_baseType)
		return true;
	if (m_precision != other.m_precision)
		return true;
	if (m_numElements != other.m_numElements)
		return true;
	if (!!m_elementType != !!other.m_elementType)
		return true;
	if (m_elementType && *m_elementType != *other.m_elementType)
		return true;
	if (m_members != other.m_members)
		return true;
	return false;
}